

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_diff.cpp
# Opt level: O2

void __thiscall
Diff_UncomittedTransaction_Test::~Diff_UncomittedTransaction_Test
          (Diff_UncomittedTransaction_Test *this)

{
  anon_unknown.dwarf_e092d::Diff::~Diff(&this->super_Diff);
  operator_delete(this,0x158);
  return;
}

Assistant:

TEST_F (Diff, UncomittedTransaction) {
    using ::testing::UnorderedElementsAre;

    using value_type = std::pair<std::string, pstore::extent<char>>;
    value_type v1;

    {
        std::string const k1 = "key1";
        transaction_type t1 = begin (db_, lock_guard{mutex_});
        v1 = std::make_pair (k1, this->add (t1, k1, "first value"));
        t1.commit ();
    }

    // The transaction t2 is left uncommitted whilst we perform the diff.
    std::string const k2 = "key2";
    transaction_type t2 = begin (db_, lock_guard{mutex_});
    value_type v2 = std::make_pair (k2, this->add (t2, k2, "second value"));

    {
        // Check the diff between now (the uncommitted r2) and r0.
        auto index = pstore::index::get_index<pstore::trailer::indices::write> (db_);
        ASSERT_NE (index, nullptr);

        std::vector<pstore::address> actual;
        pstore::diff (db_, *index, 0U, std::back_inserter (actual));
        auto const actual_values =
            addresses_to_values (db_, *index, std::begin (actual), std::end (actual));
        EXPECT_THAT (actual_values, UnorderedElementsAre (v1, v2));
    }

    {
        // Check the diff between now and r1.
        auto index = pstore::index::get_index<pstore::trailer::indices::write> (db_);
        ASSERT_NE (index, nullptr);

        std::vector<pstore::address> actual;
        pstore::diff (db_, *index, 1U, std::back_inserter (actual));
        auto const actual_values =
            addresses_to_values (db_, *index, std::begin (actual), std::end (actual));
        EXPECT_THAT (actual_values, UnorderedElementsAre (v2));
    }

    {
        // Note that get_current_revision() still reports 1 even though a transaction is open.
        EXPECT_EQ (db_.get_current_revision (), 1U);
        std::vector<pstore::address> actual;
        pstore::diff (db_, *pstore::index::get_index<pstore::trailer::indices::write> (db_), 2U,
                      std::back_inserter (actual));
        EXPECT_EQ (actual.size (), 0U);
    }

    t2.commit ();
}